

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O0

void __thiscall Liby::EventQueue::start(EventQueue *this)

{
  pointer pCVar1;
  anon_class_8_1_8991fb9c local_70;
  BasicHandler local_68;
  anon_class_8_1_8991fb9c local_38;
  BasicHandler local_30;
  EventQueue *local_10;
  EventQueue *this_local;
  
  local_10 = this;
  pCVar1 = std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator->
                     (&this->eventChanelPtr_);
  Channel::enableRead(pCVar1,true);
  pCVar1 = std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator->
                     (&this->eventChanelPtr_);
  local_38.this = this;
  std::function<void()>::function<Liby::EventQueue::start()::__0,void>
            ((function<void()> *)&local_30,&local_38);
  Channel::onErro(pCVar1,&local_30);
  std::function<void_()>::~function(&local_30);
  pCVar1 = std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator->
                     (&this->eventChanelPtr_);
  local_70.this = this;
  std::function<void()>::function<Liby::EventQueue::start()::__1,void>
            ((function<void()> *)&local_68,&local_70);
  Channel::onRead(pCVar1,&local_68);
  std::function<void_()>::~function(&local_68);
  pCVar1 = std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator->
                     (&this->eventChanelPtr_);
  Channel::addChannel(pCVar1);
  return;
}

Assistant:

void EventQueue::start() {
    eventChanelPtr_->enableRead();
    eventChanelPtr_->onErro([this] { destroy(); });
    eventChanelPtr_->onRead([this] {
        if (!eventfp_)
            return;

        char buf[128];
        int ret = ::read(eventfd_, buf, 128);
        if (ret <= 0)
            return;

        while (!eventHandlers_.empty()) {
            eventHandlers_.pop_front()();
        }
    });
    eventChanelPtr_->addChannel();
}